

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O2

TValue * cploop_opt(lua_State *L,lua_CFunction dummy,void *ud)

{
  long lVar1;
  byte *pbVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  TraceError e;
  ushort uVar9;
  TRef TVar10;
  char *pcVar11;
  undefined4 *puVar12;
  byte bVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ushort *puVar18;
  undefined4 *puVar19;
  long lVar20;
  byte bVar21;
  IRRef1 IVar22;
  ushort *puVar23;
  uint uVar24;
  ushort uVar25;
  uint uVar26;
  ushort uVar27;
  ulong uVar28;
  ulong uVar29;
  IRRef ref;
  ulong uVar30;
  ushort *puVar31;
  uint uVar32;
  ulong uVar33;
  ushort *puVar34;
  ulong uVar35;
  long lVar36;
  undefined4 uVar37;
  uint local_10c;
  IRRef1 phi [64];
  
  uVar17 = *(uint *)((long)ud + 8);
  pcVar11 = lj_str_needbuf(*(lua_State **)((long)ud + 0x60),
                           (SBuf *)((ulong)((*(lua_State **)((long)ud + 0x60))->glref).ptr32 + 0x58)
                           ,uVar17 * 2 - 0x10000);
  pcVar11[0] = '\0';
  pcVar11[1] = -0x80;
  *(undefined2 *)((long)ud + 0x9c) = 0x1180;
  *(undefined4 *)((long)ud + 0x98) = 0;
  lj_ir_emit((jit_State *)ud);
  uVar3 = *(ushort *)((long)ud + 0x1c);
  uVar26 = (uint)uVar3 * 2 - 2;
  if (*(uint *)((long)ud + 0x114) < uVar26) {
    lj_snap_grow_buf_((jit_State *)ud,uVar26);
  }
  lVar20 = *(long *)((long)ud + 0x20);
  uVar35 = (ulong)(uVar3 - 1);
  uVar26 = (uint)*(byte *)(lVar20 + 6 + uVar35 * 8) * (uVar3 - 2) +
           (uint)*(ushort *)((long)ud + 0x1e) * 2;
  if (*(uint *)((long)ud + 0x128) < uVar26) {
    lj_snap_grow_map_((jit_State *)ud,uVar26);
    lVar20 = *(long *)((long)ud + 0x20);
  }
  lVar36 = (ulong)*(ushort *)(lVar20 + uVar35 * 8) * 4 + *(long *)((long)ud + 0x28);
  uVar35 = (ulong)*(byte *)(lVar20 + 6 + uVar35 * 8);
  *(undefined4 *)(lVar36 + uVar35 * 4) = 0xff000000;
  uVar29 = 0;
  puVar23 = (ushort *)(lVar20 + 8);
  for (uVar30 = 0x8001; local_10c = (uint)uVar29, uVar30 < uVar17; uVar30 = uVar30 + 1) {
    puVar34 = puVar23;
    if (puVar23[1] <= uVar30) {
      puVar34 = puVar23 + 4;
      uVar4 = *puVar23;
      puVar31 = (ushort *)
                ((ulong)((uint)*(ushort *)((long)ud + 0x1c) * 8) + *(long *)((long)ud + 0x20));
      puVar18 = puVar34;
      if (puVar34 == puVar31) {
        puVar18 = (ushort *)((long)ud + 0x1e);
      }
      uVar14 = *puVar18;
      uVar9 = puVar23[3];
      uVar25 = puVar23[2];
      if (*(char *)((long)ud + 0x96) < '\0') {
        uVar27 = *(ushort *)((long)ud + 0x1e);
        *(ushort *)((long)ud + 0x1c) = *(ushort *)((long)ud + 0x1c) + 1;
      }
      else {
        uVar27 = puVar31[-4];
        puVar31 = puVar31 + -4;
      }
      lVar7 = *(long *)((long)ud + 0x28);
      lVar20 = lVar7 + (ulong)uVar4 * 4;
      uVar26 = 0;
      *(undefined1 *)((long)ud + 0x96) = 0;
      *puVar31 = uVar27;
      puVar31[1] = *(ushort *)((long)ud + 8);
      *(byte *)(puVar31 + 2) = (byte)uVar25;
      *(undefined1 *)((long)puVar31 + 5) = *(undefined1 *)((long)puVar23 + 5);
      *(undefined1 *)((long)puVar31 + 7) = 0;
      lVar1 = lVar7 + (ulong)uVar27 * 4;
      uVar33 = 0;
      uVar28 = 0;
      while (uVar26 < (byte)uVar9) {
        uVar16 = *(uint *)(lVar20 + (ulong)uVar26 * 4);
        uVar32 = *(uint *)(lVar36 + uVar33 * 4);
        uVar15 = uVar32 >> 0x18;
        uVar24 = uVar16 >> 0x18;
        if (uVar15 < uVar24) {
          *(uint *)(lVar1 + uVar28 * 4) = uVar32;
          uVar32 = (int)uVar33 + 1;
        }
        else {
          if (0x7fff < (uVar16 & 0xffff)) {
            uVar16 = (uint)*(ushort *)(pcVar11 + (ulong)(uVar16 & 0xffff) * 2 + -0x10000) |
                     uVar16 & 0xfffb0000;
          }
          uVar32 = (int)uVar33 + (uint)(uVar15 == uVar24);
          *(uint *)(lVar1 + uVar28 * 4) = uVar16;
          uVar26 = uVar26 + 1;
        }
        uVar33 = (ulong)uVar32;
        uVar28 = (ulong)((int)uVar28 + 1);
      }
      while( true ) {
        uVar26 = *(uint *)(lVar36 + uVar33 * 4);
        if ((uint)(byte)uVar25 <= uVar26 >> 0x18) break;
        uVar33 = (ulong)((int)uVar33 + 1);
        *(uint *)(lVar1 + uVar28 * 4) = uVar26;
        uVar28 = (ulong)((int)uVar28 + 1);
      }
      *(char *)(puVar31 + 3) = (char)uVar28;
      puVar19 = (undefined4 *)(lVar1 + uVar28 * 4);
      uVar28 = (uVar27 + uVar28) * 4;
      for (puVar12 = (undefined4 *)(lVar20 + (ulong)(uint)(byte)uVar9 * 4);
          puVar12 < (undefined4 *)(lVar7 + (ulong)uVar14 * 4); puVar12 = puVar12 + 1) {
        *puVar19 = *puVar12;
        puVar19 = puVar19 + 1;
        uVar28 = uVar28 + 4;
      }
      *(ushort *)((long)ud + 0x1e) = (ushort)(uVar28 >> 2);
    }
    lVar20 = *(long *)((long)ud + 0x10);
    uVar4 = *(ushort *)(lVar20 + uVar30 * 8);
    uVar14 = uVar4;
    if ((short)uVar4 < 0) {
      uVar14 = *(ushort *)(pcVar11 + (ulong)uVar4 * 2 + -0x10000);
    }
    uVar9 = *(ushort *)(lVar20 + 2 + uVar30 * 8);
    uVar25 = uVar9;
    if ((short)uVar9 < 0) {
      uVar25 = *(ushort *)(pcVar11 + (ulong)uVar9 * 2 + -0x10000);
    }
    if ((((lj_ir_mode[*(byte *)(lVar20 + 5 + uVar30 * 8)] & 0x60) == 0) && (uVar14 == uVar4)) &&
       (uVar25 == uVar9)) {
      *(short *)(pcVar11 + uVar30 * 2 + -0x10000) = (short)uVar30;
    }
    else {
      bVar21 = *(byte *)(lVar20 + 4 + uVar30 * 8);
      *(ushort *)((long)ud + 0x9c) = *(ushort *)(lVar20 + 4 + uVar30 * 8) & 0xffbf;
      *(ushort *)((long)ud + 0x98) = uVar14;
      *(ushort *)((long)ud + 0x9a) = uVar25;
      TVar10 = lj_opt_fold((jit_State *)ud);
      uVar26 = TVar10 & 0xffff;
      uVar28 = (ulong)uVar26;
      IVar22 = (IRRef1)TVar10;
      *(IRRef1 *)(pcVar11 + uVar30 * 2 + -0x10000) = IVar22;
      if (uVar30 != uVar28) {
        lVar20 = *(long *)((long)ud + 0x10);
        if (uVar26 < uVar17) {
          bVar13 = *(byte *)(lVar20 + 4 + uVar28 * 8);
          if ((0x7fff < uVar26) && (2 < (bVar13 & 0x1f) && (char)((bVar13 & 0x40) >> 6) == '\0')) {
            bVar13 = bVar13 | 0x40;
            *(byte *)(lVar20 + 4 + uVar28 * 8) = bVar13;
            if (0x3f < local_10c) goto LAB_0013418a;
            local_10c = local_10c + 1;
            phi[uVar29] = IVar22;
          }
          if (((bVar13 ^ bVar21) & 0x1f) != 0) {
            uVar26 = bVar21 & 0x1f;
            if (uVar26 - 0x14 < 0xfffffffb) {
              if ((uVar26 == 0xe) && (uVar37 = 0x550e01d3, (bVar13 & 0x1f) - 0xf < 5)) {
LAB_00133e08:
                *(IRRef1 *)((long)ud + 0x98) = IVar22;
                *(undefined4 *)((long)ud + 0x9a) = uVar37;
                TVar10 = lj_opt_fold((jit_State *)ud);
                uVar26 = TVar10 & 0xffff;
                *(short *)(pcVar11 + uVar30 * 2 + -0x10000) = (short)TVar10;
                lVar20 = (ulong)(uVar26 * 8) + *(long *)((long)ud + 0x10);
                goto LAB_00133e45;
              }
            }
            else {
              if ((bVar13 & 0x1f) - 0xf < 5) goto LAB_00133d0b;
              uVar37 = 0x5593326e;
              if ((bVar13 & 0x1f) == 0xe) goto LAB_00133e08;
            }
            e = LJ_TRERR_TYPEINS;
            goto LAB_0013418c;
          }
        }
        else if (((uVar26 != 0xffff) && (uVar17 < uVar26)) &&
                (*(char *)(lVar20 + 5 + uVar28 * 8) == 'U')) {
          uVar4 = *(ushort *)(lVar20 + uVar28 * 8);
          uVar26 = (uint)uVar4;
          if (uVar4 < uVar17) {
            lVar20 = lVar20 + (ulong)uVar4 * 8;
LAB_00133e45:
            if ((0x7fff < uVar26 && uVar26 < uVar17) && ((*(byte *)(lVar20 + 4) & 0x40) == 0)) {
              *(byte *)(lVar20 + 4) = *(byte *)(lVar20 + 4) | 0x40;
              if (0x3f < local_10c) goto LAB_0013418a;
              uVar29 = (ulong)local_10c;
              local_10c = local_10c + 1;
              phi[uVar29] = (IRRef1)uVar26;
            }
          }
        }
      }
    }
LAB_00133d0b:
    uVar29 = (ulong)local_10c;
    puVar23 = puVar34;
  }
  if (-1 < *(char *)((long)ud + 0x96)) {
    uVar17 = *(int *)((long)ud + 0x1c) - 1;
    *(short *)((long)ud + 0x1c) = (short)uVar17;
    *(undefined2 *)((long)ud + 0x1e) =
         *(undefined2 *)(*(long *)((long)ud + 0x20) + (ulong)(uVar17 & 0xffff) * 8);
  }
  *(undefined4 *)(lVar36 + uVar35 * 4) =
       *(undefined4 *)
        (*(long *)((long)ud + 0x28) + (ulong)*(byte *)(*(long *)((long)ud + 0x20) + 6) * 4);
  uVar4 = *(ushort *)((long)ud + 0x162);
  uVar35 = 0;
  bVar8 = false;
  for (uVar30 = 0; uVar29 != uVar30; uVar30 = uVar30 + 1) {
    uVar14 = phi[uVar30];
    uVar28 = (ulong)uVar14;
    uVar9 = *(ushort *)(pcVar11 + uVar28 * 2 + -0x10000);
    if ((uVar14 == uVar9) || (uVar9 == 0xffff)) {
      pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + uVar28 * 8);
      *pbVar2 = *pbVar2 & 0xbf;
    }
    else {
      uVar33 = (ulong)((int)uVar35 + 1);
      phi[uVar35] = uVar14;
      lVar20 = *(long *)((long)ud + 0x10);
      uVar35 = uVar33;
      if ((*(ushort *)(lVar20 + (ulong)uVar9 * 8) != uVar14) &&
         (*(ushort *)(lVar20 + 2 + (ulong)uVar9 * 8) != uVar14)) {
        pbVar2 = (byte *)(lVar20 + 4 + uVar28 * 8);
        *pbVar2 = *pbVar2 | 0x20;
        bVar8 = true;
      }
    }
  }
  if (bVar8) {
    uVar17 = *(uint *)((long)ud + 8);
LAB_00133f49:
    uVar17 = uVar17 - 1;
    if (uVar4 < uVar17) {
      lVar20 = *(long *)((long)ud + 0x10);
      uVar29 = (ulong)uVar17;
      uVar14 = *(ushort *)(lVar20 + 2 + uVar29 * 8);
      if ((short)uVar14 < 0) {
        pbVar2 = (byte *)(lVar20 + 4 + (ulong)uVar14 * 8);
        *pbVar2 = *pbVar2 & 0xdf;
      }
      uVar14 = *(ushort *)(lVar20 + uVar29 * 8);
      if ((short)uVar14 < 0) {
        pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)uVar14 * 8);
        *pbVar2 = *pbVar2 & 0xdf;
        uVar14 = *(ushort *)(lVar20 + uVar29 * 8);
        if ((uVar14 < uVar4) && ((byte)(*(char *)(lVar20 + 5 + uVar29 * 8) + 0xa7U) < 5)) {
          puVar23 = (ushort *)((ulong)uVar14 * 8 + *(long *)((long)ud + 0x10));
          while (*(char *)((long)puVar23 + 5) == ']') {
            if ((short)puVar23[1] < 0) {
              pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)puVar23[1] * 8);
              *pbVar2 = *pbVar2 & 0xdf;
            }
            if (-1 < (short)*puVar23) break;
            puVar23 = (ushort *)(*(long *)((long)ud + 0x10) + (ulong)*puVar23 * 8);
            *(byte *)(puVar23 + 2) = (byte)puVar23[2] & 0xdf;
          }
        }
      }
      goto LAB_00133f49;
    }
    uVar17 = (uint)*(ushort *)((long)ud + 0x1c);
    while (uVar17 = uVar17 - 1, uVar3 <= uVar17) {
      uVar14 = *(ushort *)(*(long *)((long)ud + 0x20) + (ulong)uVar17 * 8);
      lVar20 = *(long *)((long)ud + 0x28);
      bVar21 = *(byte *)(*(long *)((long)ud + 0x20) + 6 + (ulong)uVar17 * 8);
      for (uVar29 = 0; bVar21 != uVar29; uVar29 = uVar29 + 1) {
        uVar9 = *(ushort *)((ulong)uVar14 * 4 + lVar20 + uVar29 * 4);
        if (0x7fff < uVar9) {
          pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)uVar9 * 8);
          *pbVar2 = *pbVar2 & 0xdf;
        }
      }
    }
  }
  iVar5 = *(int *)((long)ud + 0x8c);
  iVar6 = *(int *)((long)ud + 0x90);
  uVar29 = 1;
  do {
    uVar35 = uVar35 & 0xffffffff;
    if ((uint)(iVar5 + iVar6) <= uVar29) {
      while (bVar8) {
        bVar8 = false;
        for (uVar29 = 0; uVar35 != uVar29; uVar29 = uVar29 + 1) {
          lVar20 = *(long *)((long)ud + 0x10);
          if ((*(byte *)(lVar20 + 4 + (ulong)phi[uVar29] * 8) & 0x20) == 0) {
            bVar21 = *(byte *)(lVar20 + 4 +
                              (ulong)*(ushort *)(pcVar11 + (ulong)phi[uVar29] * 2 + -0x10000) * 8);
            if ((bVar21 & 0x20) != 0) {
              *(byte *)(lVar20 + 4 +
                       (ulong)*(ushort *)(pcVar11 + (ulong)phi[uVar29] * 2 + -0x10000) * 8) =
                   bVar21 & 0xdf;
              bVar8 = true;
            }
          }
        }
      }
      for (uVar29 = 0; uVar35 != uVar29; uVar29 = uVar29 + 1) {
        uVar3 = phi[uVar29];
        uVar30 = (ulong)uVar3;
        lVar20 = *(long *)((long)ud + 0x10);
        bVar21 = *(byte *)(lVar20 + 4 + uVar30 * 8);
        if ((bVar21 & 0x20) == 0) {
          uVar14 = *(ushort *)(pcVar11 + uVar30 * 2 + -0x10000);
          if (uVar4 < uVar14) {
            pbVar2 = (byte *)(lVar20 + 4 + (ulong)uVar14 * 8);
            *pbVar2 = *pbVar2 | 0x40;
            bVar21 = *(byte *)(lVar20 + 4 + uVar30 * 8);
          }
          *(ushort *)((long)ud + 0x9c) = bVar21 & 0x1f | 0x1300;
          *(ushort *)((long)ud + 0x98) = uVar3;
          *(ushort *)((long)ud + 0x9a) = uVar14;
          lj_ir_emit((jit_State *)ud);
        }
        else {
          *(byte *)(lVar20 + 4 + uVar30 * 8) = bVar21 & 0x9f;
        }
      }
      return (TValue *)0x0;
    }
    uVar3 = *(ushort *)((long)ud + uVar29 * 4 + 0x1fc);
    while ((uVar17 = (uint)uVar3, 0x7fff < uVar17 &&
           (uVar30 = (ulong)uVar17, uVar17 != *(ushort *)(pcVar11 + uVar30 * 2 + -0x10000)))) {
      lVar20 = *(long *)((long)ud + 0x10);
      bVar21 = *(byte *)(lVar20 + 4 + uVar30 * 8);
      *(byte *)(lVar20 + 4 + uVar30 * 8) = bVar21 & 0xdf;
      if (((bVar21 & 0x40) != 0) || ((bVar21 & 0x1f) < 3)) break;
      *(byte *)(lVar20 + 4 + uVar30 * 8) = bVar21 & 0xdf | 0x40;
      if (0x3f < uVar35) goto LAB_0013418a;
      phi[uVar35] = uVar3;
      uVar35 = uVar35 + 1;
      uVar3 = *(ushort *)(pcVar11 + uVar30 * 2 + -0x10000);
      if (uVar4 < uVar3) break;
    }
    uVar29 = uVar29 + 1;
  } while( true );
LAB_0013418a:
  e = LJ_TRERR_PHIOV;
LAB_0013418c:
  lj_trace_err((jit_State *)ud,e);
}

Assistant:

static TValue *cploop_opt(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(L); UNUSED(dummy);
  loop_unroll((jit_State *)ud);
  return NULL;
}